

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O3

void al_fill_silence(void *buf,uint samples,ALLEGRO_AUDIO_DEPTH depth,ALLEGRO_CHANNEL_CONF chan_conf
                    )

{
  undefined1 auVar1 [16];
  ulong uVar2;
  size_t __n;
  long lVar3;
  int iVar6;
  undefined1 auVar4 [16];
  int iVar7;
  undefined1 auVar5 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  int iVar25;
  int iVar28;
  undefined1 auVar26 [16];
  int iVar29;
  undefined1 auVar27 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar30 [16];
  undefined1 in_XMM12 [16];
  
  auVar1 = _DAT_00112020;
  switch(depth) {
  case ALLEGRO_AUDIO_DEPTH_INT8:
  case ALLEGRO_AUDIO_DEPTH_UINT8:
    lVar3 = 1;
    break;
  case ALLEGRO_AUDIO_DEPTH_INT16:
  case ALLEGRO_AUDIO_DEPTH_UINT16:
    lVar3 = 2;
    break;
  case ALLEGRO_AUDIO_DEPTH_INT24:
  case ALLEGRO_AUDIO_DEPTH_UINT24:
    lVar3 = 4;
    break;
  case ALLEGRO_AUDIO_DEPTH_FLOAT32:
    __n = (ulong)samples * (ulong)(((chan_conf >> 4) - (chan_conf & 0xfffffff0)) + chan_conf) * 4;
    goto switchD_00106c77_caseD_0;
  default:
    lVar3 = 0;
  }
  if (depth < (ALLEGRO_AUDIO_DEPTH_UINT24|ALLEGRO_AUDIO_DEPTH_INT16)) {
    __n = (ulong)samples * lVar3 *
          (ulong)(((chan_conf >> 4) - (chan_conf & 0xfffffff0)) + chan_conf);
    switch(depth) {
    default:
switchD_00106c77_caseD_0:
      memset(buf,0,__n);
      return;
    case 4:
    case 5:
    case 6:
    case 7:
      break;
    case ALLEGRO_AUDIO_DEPTH_UINT8:
      memset(buf,0x80,__n);
      return;
    case ALLEGRO_AUDIO_DEPTH_UINT16:
      if (1 < __n) {
        lVar3 = (__n >> 1) - 1;
        auVar4._8_4_ = (int)lVar3;
        auVar4._0_8_ = lVar3;
        auVar4._12_4_ = (int)((ulong)lVar3 >> 0x20);
        uVar2 = 0;
        auVar4 = auVar4 ^ _DAT_00112020;
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar12 = _DAT_00112040;
        auVar8 = _DAT_00112050;
        auVar9 = _DAT_00112000;
        auVar10 = _DAT_00112010;
        do {
          auVar13 = auVar10 ^ auVar1;
          iVar25 = auVar4._0_4_;
          iVar24 = -(uint)(iVar25 < auVar13._0_4_);
          iVar6 = auVar4._4_4_;
          auVar14._4_4_ = -(uint)(iVar6 < auVar13._4_4_);
          iVar29 = auVar4._8_4_;
          iVar28 = -(uint)(iVar29 < auVar13._8_4_);
          iVar7 = auVar4._12_4_;
          auVar14._12_4_ = -(uint)(iVar7 < auVar13._12_4_);
          auVar21._4_4_ = iVar24;
          auVar21._0_4_ = iVar24;
          auVar21._8_4_ = iVar28;
          auVar21._12_4_ = iVar28;
          auVar30 = pshuflw(in_XMM11,auVar21,0xe8);
          auVar16._4_4_ = -(uint)(auVar13._4_4_ == iVar6);
          auVar16._12_4_ = -(uint)(auVar13._12_4_ == iVar7);
          auVar16._0_4_ = auVar16._4_4_;
          auVar16._8_4_ = auVar16._12_4_;
          auVar5 = pshuflw(in_XMM12,auVar16,0xe8);
          auVar14._0_4_ = auVar14._4_4_;
          auVar14._8_4_ = auVar14._12_4_;
          auVar13 = pshuflw(auVar30,auVar14,0xe8);
          auVar13 = (auVar13 | auVar5 & auVar30) ^ auVar11;
          auVar13 = packssdw(auVar13,auVar13);
          if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)buf + uVar2 * 2) = 0x8000;
          }
          auVar14 = auVar16 & auVar21 | auVar14;
          auVar13 = packssdw(auVar14,auVar14);
          auVar13 = packssdw(auVar13 ^ auVar11,auVar13 ^ auVar11);
          if ((auVar13._0_4_ >> 0x10 & 1) != 0) {
            *(undefined2 *)((long)buf + uVar2 * 2 + 2) = 0x8000;
          }
          auVar13 = auVar9 ^ auVar1;
          iVar24 = -(uint)(iVar25 < auVar13._0_4_);
          auVar26._4_4_ = -(uint)(iVar6 < auVar13._4_4_);
          iVar28 = -(uint)(iVar29 < auVar13._8_4_);
          auVar26._12_4_ = -(uint)(iVar7 < auVar13._12_4_);
          auVar15._4_4_ = iVar24;
          auVar15._0_4_ = iVar24;
          auVar15._8_4_ = iVar28;
          auVar15._12_4_ = iVar28;
          auVar20._4_4_ = -(uint)(auVar13._4_4_ == iVar6);
          auVar20._12_4_ = -(uint)(auVar13._12_4_ == iVar7);
          auVar20._0_4_ = auVar20._4_4_;
          auVar20._8_4_ = auVar20._12_4_;
          auVar26._0_4_ = auVar26._4_4_;
          auVar26._8_4_ = auVar26._12_4_;
          auVar13 = auVar20 & auVar15 | auVar26;
          auVar13 = packssdw(auVar13,auVar13);
          auVar13 = packssdw(auVar13 ^ auVar11,auVar13 ^ auVar11);
          if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)buf + uVar2 * 2 + 4) = 0x8000;
          }
          auVar16 = pshufhw(auVar15,auVar15,0x84);
          auVar21 = pshufhw(auVar20,auVar20,0x84);
          auVar14 = pshufhw(auVar16,auVar26,0x84);
          auVar16 = (auVar14 | auVar21 & auVar16) ^ auVar11;
          auVar16 = packssdw(auVar16,auVar16);
          if ((auVar16 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)buf + uVar2 * 2 + 6) = 0x8000;
          }
          auVar16 = auVar8 ^ auVar1;
          iVar24 = -(uint)(iVar25 < auVar16._0_4_);
          auVar18._4_4_ = -(uint)(iVar6 < auVar16._4_4_);
          iVar28 = -(uint)(iVar29 < auVar16._8_4_);
          auVar18._12_4_ = -(uint)(iVar7 < auVar16._12_4_);
          auVar22._4_4_ = iVar24;
          auVar22._0_4_ = iVar24;
          auVar22._8_4_ = iVar28;
          auVar22._12_4_ = iVar28;
          auVar13 = pshuflw(auVar13,auVar22,0xe8);
          auVar17._4_4_ = -(uint)(auVar16._4_4_ == iVar6);
          auVar17._12_4_ = -(uint)(auVar16._12_4_ == iVar7);
          auVar17._0_4_ = auVar17._4_4_;
          auVar17._8_4_ = auVar17._12_4_;
          auVar30 = pshuflw(auVar5 & auVar30,auVar17,0xe8);
          in_XMM12 = auVar30 & auVar13;
          auVar18._0_4_ = auVar18._4_4_;
          auVar18._8_4_ = auVar18._12_4_;
          auVar13 = pshuflw(auVar13,auVar18,0xe8);
          auVar13 = (auVar13 | in_XMM12) ^ auVar11;
          auVar13 = packssdw(auVar13,auVar13);
          if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)buf + uVar2 * 2 + 8) = 0x8000;
          }
          auVar18 = auVar17 & auVar22 | auVar18;
          auVar13 = packssdw(auVar18,auVar18);
          auVar13 = packssdw(auVar13 ^ auVar11,auVar13 ^ auVar11);
          if ((auVar13 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)buf + uVar2 * 2 + 10) = 0x8000;
          }
          auVar13 = auVar12 ^ auVar1;
          iVar25 = -(uint)(iVar25 < auVar13._0_4_);
          auVar27._4_4_ = -(uint)(iVar6 < auVar13._4_4_);
          iVar29 = -(uint)(iVar29 < auVar13._8_4_);
          auVar27._12_4_ = -(uint)(iVar7 < auVar13._12_4_);
          auVar19._4_4_ = iVar25;
          auVar19._0_4_ = iVar25;
          auVar19._8_4_ = iVar29;
          auVar19._12_4_ = iVar29;
          auVar23._4_4_ = -(uint)(auVar13._4_4_ == iVar6);
          auVar23._12_4_ = -(uint)(auVar13._12_4_ == iVar7);
          auVar23._0_4_ = auVar23._4_4_;
          auVar23._8_4_ = auVar23._12_4_;
          auVar27._0_4_ = auVar27._4_4_;
          auVar27._8_4_ = auVar27._12_4_;
          auVar13 = auVar23 & auVar19 | auVar27;
          auVar13 = packssdw(auVar13,auVar13);
          in_XMM11 = packssdw(auVar13 ^ auVar11,auVar13 ^ auVar11);
          if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)buf + uVar2 * 2 + 0xc) = 0x8000;
          }
          auVar13 = pshufhw(auVar19,auVar19,0x84);
          auVar5 = pshufhw(auVar23,auVar23,0x84);
          auVar30 = pshufhw(auVar13,auVar27,0x84);
          auVar13 = (auVar30 | auVar5 & auVar13) ^ auVar11;
          auVar13 = packssdw(auVar13,auVar13);
          if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)buf + uVar2 * 2 + 0xe) = 0x8000;
          }
          uVar2 = uVar2 + 8;
          lVar3 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 8;
          auVar10._8_8_ = lVar3 + 8;
          lVar3 = auVar9._8_8_;
          auVar9._0_8_ = auVar9._0_8_ + 8;
          auVar9._8_8_ = lVar3 + 8;
          lVar3 = auVar8._8_8_;
          auVar8._0_8_ = auVar8._0_8_ + 8;
          auVar8._8_8_ = lVar3 + 8;
          lVar3 = auVar12._8_8_;
          auVar12._0_8_ = auVar12._0_8_ + 8;
          auVar12._8_8_ = lVar3 + 8;
        } while (((__n >> 1) + 7 & 0xfffffffffffffff8) != uVar2);
      }
      break;
    case ALLEGRO_AUDIO_DEPTH_UINT24:
      if (3 < __n) {
        lVar3 = (__n >> 2) - 1;
        auVar5._8_4_ = (int)lVar3;
        auVar5._0_8_ = lVar3;
        auVar5._12_4_ = (int)((ulong)lVar3 >> 0x20);
        uVar2 = 0;
        auVar5 = auVar5 ^ _DAT_00112020;
        auVar13 = _DAT_00112000;
        auVar30 = _DAT_00112010;
        do {
          auVar12 = auVar30 ^ auVar1;
          iVar25 = auVar5._4_4_;
          if ((bool)(~(auVar12._4_4_ == iVar25 && auVar5._0_4_ < auVar12._0_4_ ||
                      iVar25 < auVar12._4_4_) & 1)) {
            *(undefined4 *)((long)buf + uVar2 * 4) = 0x800000;
          }
          if ((auVar12._12_4_ != auVar5._12_4_ || auVar12._8_4_ <= auVar5._8_4_) &&
              auVar12._12_4_ <= auVar5._12_4_) {
            *(undefined4 *)((long)buf + uVar2 * 4 + 4) = 0x800000;
          }
          iVar6 = SUB164(auVar13 ^ auVar1,4);
          if (iVar6 <= iVar25 && (iVar6 != iVar25 || SUB164(auVar13 ^ auVar1,0) <= auVar5._0_4_)) {
            *(undefined4 *)((long)buf + uVar2 * 4 + 8) = 0x800000;
            *(undefined4 *)((long)buf + uVar2 * 4 + 0xc) = 0x800000;
          }
          uVar2 = uVar2 + 4;
          lVar3 = auVar30._8_8_;
          auVar30._0_8_ = auVar30._0_8_ + 4;
          auVar30._8_8_ = lVar3 + 4;
          lVar3 = auVar13._8_8_;
          auVar13._0_8_ = auVar13._0_8_ + 4;
          auVar13._8_8_ = lVar3 + 4;
        } while (((__n >> 2) + 3 & 0xfffffffffffffffc) != uVar2);
      }
    }
  }
  return;
}

Assistant:

void al_fill_silence(void *buf, unsigned int samples,
   ALLEGRO_AUDIO_DEPTH depth, ALLEGRO_CHANNEL_CONF chan_conf)
{
   size_t bytes = samples * al_get_audio_depth_size(depth) *
      al_get_channel_count(chan_conf);

   switch (depth) {
      case ALLEGRO_AUDIO_DEPTH_INT8:
      case ALLEGRO_AUDIO_DEPTH_INT16:
      case ALLEGRO_AUDIO_DEPTH_INT24:
      case ALLEGRO_AUDIO_DEPTH_FLOAT32:
         memset(buf, 0, bytes);
         break;
      case ALLEGRO_AUDIO_DEPTH_UINT8:
         memset(buf, 0x80, bytes);
         break;
      case ALLEGRO_AUDIO_DEPTH_UINT16:
         {
            uint16_t *buffer = buf;
            size_t n = bytes / sizeof(uint16_t);
            size_t i;

            for (i = 0; i < n; i++)
               buffer[i] = 0x8000;
         }
         break;
      case ALLEGRO_AUDIO_DEPTH_UINT24:
         {
            uint32_t *buffer = buf;
            size_t n = bytes / sizeof(uint32_t);
            size_t i;

            for (i = 0; i < n; i++)
               buffer[i] = 0x800000;
         }
         break;
      default:
         ASSERT(false);
         break;
   }
}